

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SequenceWithMatchExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SequenceWithMatchExpr,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRepetition>&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
          (BumpAllocator *this,AssertionExpr *args,optional<slang::ast::SequenceRepetition> *args_1,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer ppEVar3;
  size_type sVar4;
  bool bVar5;
  undefined3 uVar6;
  SequenceWithMatchExpr *pSVar7;
  
  pSVar7 = (SequenceWithMatchExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SequenceWithMatchExpr *)this->endPtr < pSVar7 + 1) {
    pSVar7 = (SequenceWithMatchExpr *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pSVar7 + 1);
  }
  bVar5 = (args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
          super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged;
  uVar6 = *(undefined3 *)
           &(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRepetition>.field_0x11;
  uVar1 = *(undefined8 *)
           &(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload;
  uVar2 = *(undefined8 *)
           ((long)&(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>).
                   _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>.
                   _M_payload + 8);
  ppEVar3 = args_2->data_;
  sVar4 = args_2->size_;
  (pSVar7->super_AssertionExpr).kind = SequenceWithMatch;
  (pSVar7->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pSVar7->expr = args;
  *(undefined8 *)
   &(pSVar7->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
    .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload = uVar1;
  *(undefined8 *)
   ((long)&(pSVar7->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
           _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload + 8) =
       uVar2;
  (pSVar7->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged = bVar5;
  *(undefined3 *)
   &(pSVar7->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
    .super__Optional_payload_base<slang::ast::SequenceRepetition>.field_0x11 = uVar6;
  (pSVar7->matchItems).data_ = ppEVar3;
  (pSVar7->matchItems).size_ = sVar4;
  return pSVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }